

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

VdbeOp * sqlite3VdbeAddOpList(Vdbe *p,int nOp,VdbeOpList *aOp,int iLineno)

{
  int iVar1;
  VdbeOp *pVVar2;
  byte *in_RDX;
  int in_ESI;
  long in_RDI;
  VdbeOp *pFirst;
  VdbeOp *pOut;
  int i;
  VdbeOp *local_30;
  int local_28;
  undefined4 in_stack_ffffffffffffffe8;
  
  if ((*(int *)(*(long *)(in_RDI + 0x18) + 0x3c) < *(int *)(in_RDI + 0xb8) + in_ESI) &&
     (iVar1 = growOpArray((Vdbe *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                          (int)((ulong)in_RDX >> 0x20)), iVar1 != 0)) {
    return (VdbeOp *)0x0;
  }
  pVVar2 = (VdbeOp *)(*(long *)(in_RDI + 0x68) + (long)*(int *)(in_RDI + 0xb8) * 0x18);
  local_30 = pVVar2;
  for (local_28 = 0; local_28 < in_ESI; local_28 = local_28 + 1) {
    local_30->opcode = *in_RDX;
    local_30->p1 = (int)(char)in_RDX[1];
    local_30->p2 = (int)(char)in_RDX[2];
    if (((""[*in_RDX] & 1) != 0) && ('\0' < (char)in_RDX[2])) {
      local_30->p2 = *(int *)(in_RDI + 0xb8) + local_30->p2;
    }
    local_30->p3 = (int)(char)in_RDX[3];
    local_30->p4type = '\0';
    (local_30->p4).p = (void *)0x0;
    local_30->p5 = 0;
    in_RDX = in_RDX + 4;
    local_30 = local_30 + 1;
  }
  *(int *)(in_RDI + 0xb8) = in_ESI + *(int *)(in_RDI + 0xb8);
  return pVVar2;
}

Assistant:

SQLITE_PRIVATE VdbeOp *sqlite3VdbeAddOpList(
  Vdbe *p,                     /* Add opcodes to the prepared statement */
  int nOp,                     /* Number of opcodes to add */
  VdbeOpList const *aOp,       /* The opcodes to be added */
  int iLineno                  /* Source-file line number of first opcode */
){
  int i;
  VdbeOp *pOut, *pFirst;
  assert( nOp>0 );
  assert( p->magic==VDBE_MAGIC_INIT );
  if( p->nOp + nOp > p->pParse->nOpAlloc && growOpArray(p, nOp) ){
    return 0;
  }
  pFirst = pOut = &p->aOp[p->nOp];
  for(i=0; i<nOp; i++, aOp++, pOut++){
    pOut->opcode = aOp->opcode;
    pOut->p1 = aOp->p1;
    pOut->p2 = aOp->p2;
    assert( aOp->p2>=0 );
    if( (sqlite3OpcodeProperty[aOp->opcode] & OPFLG_JUMP)!=0 && aOp->p2>0 ){
      pOut->p2 += p->nOp;
    }
    pOut->p3 = aOp->p3;
    pOut->p4type = P4_NOTUSED;
    pOut->p4.p = 0;
    pOut->p5 = 0;
#ifdef SQLITE_ENABLE_EXPLAIN_COMMENTS
    pOut->zComment = 0;
#endif
#ifdef SQLITE_VDBE_COVERAGE
    pOut->iSrcLine = iLineno+i;
#else
    (void)iLineno;
#endif
#ifdef SQLITE_DEBUG
    if( p->db->flags & SQLITE_VdbeAddopTrace ){
      sqlite3VdbePrintOp(0, i+p->nOp, &p->aOp[i+p->nOp]);
    }
#endif
  }
  p->nOp += nOp;
  return pFirst;
}